

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

long getDisp8N(PDISASM pMyDisasm)

{
  int iVar1;
  long local_18;
  long N;
  PDISASM pMyDisasm_local;
  
  switch((pMyDisasm->Reserved_).EVEX.tupletype) {
  case '\x01':
    if ((pMyDisasm->Reserved_).EVEX.b == '\0') {
      iVar1 = (1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 4;
    }
    else {
      iVar1 = (1 << ((pMyDisasm->Reserved_).EVEX.W & 0x1f)) << 2;
    }
    local_18 = (long)iVar1;
    break;
  case '\x02':
    if ((pMyDisasm->Reserved_).EVEX.b == '\0') {
      local_18 = (long)((1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 3);
    }
    else {
      local_18 = 4;
    }
    break;
  case '\x03':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 4);
    break;
  case '\x04':
    local_18 = 1;
    break;
  case '\x05':
    local_18 = 2;
    break;
  case '\x06':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).EVEX.W & 0x1f)) << 2);
    break;
  case '\a':
    local_18 = 4;
    break;
  case '\b':
    local_18 = 8;
    break;
  case '\t':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).EVEX.W & 0x1f)) << 3);
    break;
  case '\n':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).EVEX.W & 0x1f)) << 4);
    break;
  case '\v':
    local_18 = 0x20;
    break;
  case '\f':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 3);
    break;
  case '\r':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 2);
    break;
  case '\x0e':
    local_18 = (long)((1 << ((pMyDisasm->Reserved_).VEX.L & 0x1f)) << 1);
    break;
  case '\x0f':
    local_18 = 0x10;
    break;
  case '\x10':
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      local_18 = 8;
    }
    else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
      local_18 = 0x20;
    }
    else if ((pMyDisasm->Reserved_).VEX.L == '\x02') {
      local_18 = 0x40;
    }
    else {
      local_18 = -1;
    }
    break;
  default:
    local_18 = -1;
  }
  return local_18;
}

Assistant:

long __bea_callspec__ getDisp8N(PDISASM pMyDisasm)
{
  long N;
  switch (GV.EVEX.tupletype) {
    case FULL:
      if (GV.EVEX.b == 0) {
        N = 16 * (1 << GV.VEX.L);
      }
      else {
        N = 4 * (1 << GV.EVEX.W);
      }
      break;
    case HALF:
      if (GV.EVEX.b == 0) {
        N = 8 * (1 << GV.VEX.L);
      }
      else {
        N = 4;
      }
      break;
    case FULL_MEM:
      N = 16 * (1 << GV.VEX.L);
      break;
    case TUPLE1_SCALAR:
      N = 4 * (1 << GV.EVEX.W);
      break;
    case TUPLE1_SCALAR__8:
      N = 1;
      break;
    case TUPLE1_SCALAR__16:
      N = 2;
      break;
    case TUPLE1_FIXED__32:
      N = 4;
      break;
    case TUPLE1_FIXED__64:
      N = 8;
      break;
    case TUPLE2:
      N = 8 * (1 << GV.EVEX.W);
      break;
    case TUPLE4:
      N = 16 * (1 << GV.EVEX.W);
      break;
    case TUPLE8:
      N = 32;
      break;
    case HALF_MEM:
      N = 8 * (1 << GV.VEX.L);
      break;
    case QUARTER_MEM:
      N = 4 * (1 << GV.VEX.L);
      break;
    case EIGHTH_MEM:
      N = 2 * (1 << GV.VEX.L);
      break;
    case MEM128:
      N = 16;
      break;
    case MOVDDUP:
      if (GV.VEX.L == 0) {
        N = 8;
      }
      else if (GV.VEX.L == 1) {
        N = 32;
      }
      else if (GV.VEX.L == 2) {
        N = 64;
      }
      else {
        N = -1;
      }
      break;
    default:
      N = -1;
  }
  return N;
}